

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void __thiscall
DensityCalculator<double,float>::initialize_bdens_ext<InputData<float,int>>
          (DensityCalculator<double,float> *this,InputData<float,_int> *input_data,
          ModelParams *model_params,vector<unsigned_long,_std::allocator<unsigned_long>_> *ix_arr,
          ColumnSampler<double> *col_sampler,bool col_sampler_is_fresh)

{
  iterator __position;
  double *pdVar1;
  ulong col_num;
  size_t *ix_arr_00;
  ModelParams *pMVar2;
  size_t sVar3;
  DensityCalculator<double,float> *this_00;
  bool unsplittable;
  vector<double,std::allocator<double>> *local_50;
  ModelParams *local_48;
  ulong local_40;
  double local_38;
  
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)(this + 0xf8),model_params->max_depth + 3);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)(this + 0x110),model_params->max_depth + 3);
  local_38 = 0.0;
  __position._M_current = *(double **)(this + 0x100);
  if (__position._M_current == *(double **)(this + 0x108)) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              ((vector<double,_std::allocator<double>_> *)(this + 0xf8),__position,&local_38);
  }
  else {
    *__position._M_current = 0.0;
    *(double **)(this + 0x100) = __position._M_current + 1;
  }
  pdVar1 = input_data->range_low;
  local_50 = (vector<double,std::allocator<double>> *)(this + 0x48);
  if (pdVar1 == (double *)0x0) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)local_50,input_data->ncols_numeric);
    this_00 = this + 0x60;
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)this_00,input_data->ncols_numeric);
    unsplittable = false;
    if (input_data->ncols_numeric != 0) {
      ColumnSampler<double>::prepare_full_pass(col_sampler);
      sVar3 = col_sampler->curr_col;
      local_48 = model_params;
      if (col_sampler->curr_pos != 0 && col_sampler->curr_pos != sVar3) {
        do {
          pMVar2 = local_48;
          col_sampler->last_given = sVar3;
          col_sampler->curr_col = sVar3 + 1;
          col_num = (col_sampler->col_indices).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar3];
          if (col_num < input_data->ncols_numeric) {
            ix_arr_00 = (ix_arr->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data._M_start;
            if (input_data->Xc_indptr == (int *)0x0) {
              get_range<float>(ix_arr_00,input_data->numeric_data + input_data->nrows * col_num,0,
                               ((long)(ix_arr->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)ix_arr_00
                               >> 3) - 1,model_params->missing_action,
                               (double *)(*(long *)local_50 + col_num * 8),
                               (double *)(col_num * 8 + *(long *)this_00),&unsplittable);
            }
            else {
              local_40 = (ulong)model_params->missing_action;
              get_range<float,int>
                        (ix_arr_00,0,
                         ((long)(ix_arr->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)ix_arr_00 >> 3) -
                         1,col_num,input_data->Xc,input_data->Xc_ind,input_data->Xc_indptr,
                         model_params->missing_action,(double *)(*(long *)local_50 + col_num * 8),
                         (double *)(col_num * 8 + *(long *)this_00),&unsplittable);
              model_params = pMVar2;
            }
            if (unsplittable == true) {
              *(undefined8 *)(*(long *)local_50 + col_num * 8) = 0;
              *(undefined8 *)(*(long *)this_00 + col_num * 8) = 0;
              ColumnSampler<double>::drop_col(col_sampler,col_num,0xffffffffffffffff);
            }
          }
        } while ((col_sampler->curr_pos != 0) &&
                (sVar3 = col_sampler->curr_col, col_sampler->curr_pos != sVar3));
      }
    }
  }
  else {
    std::vector<double,std::allocator<double>>::_M_assign_aux<double*>
              (local_50,pdVar1,pdVar1 + input_data->ncols_numeric);
    std::vector<double,std::allocator<double>>::_M_assign_aux<double*>
              ((vector<double,std::allocator<double>> *)(this + 0x60),input_data->range_high,
               input_data->range_high + input_data->ncols_numeric);
  }
  return;
}

Assistant:

void DensityCalculator<ldouble_safe, real_t>::initialize_bdens_ext(const InputData &input_data,
                                             const ModelParams &model_params,
                                             std::vector<size_t> &ix_arr,
                                             ColumnSampler<ldouble_safe> &col_sampler,
                                             bool col_sampler_is_fresh)
{
    this->vals_ext_box.reserve(model_params.max_depth + 3);
    this->queue_ext_box.reserve(model_params.max_depth + 3);
    this->vals_ext_box.push_back(0);

    if (input_data.range_low != NULL)
    {
        this->box_low.assign(input_data.range_low, input_data.range_low + input_data.ncols_numeric);
        this->box_high.assign(input_data.range_high, input_data.range_high + input_data.ncols_numeric);
        return;
    }

    this->box_low.resize(input_data.ncols_numeric);
    this->box_high.resize(input_data.ncols_numeric);
    bool unsplittable = false;

    /* TODO: find out if there's an optimal point for choosing one or the other loop
       when using 'leave_m_cols' and when using 'prob_pick_col_by_range', then fill in the
       lines that are commented out. */
    // if (!input_data.ncols_categ || model_params.ncols_per_tree < input_data.ncols_numeric)
    if (input_data.ncols_numeric)
    {
        col_sampler.prepare_full_pass();
        size_t col;
        while (col_sampler.sample_col(col))
        {
            if (col >= input_data.ncols_numeric)
                continue;
            if (input_data.Xc_indptr != NULL)
            {
                get_range((size_t*)ix_arr.data(), (size_t)0, ix_arr.size()-(size_t)1, col,
                          input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                          model_params.missing_action, this->box_low[col], this->box_high[col], unsplittable);
            }

            else
            {
                get_range((size_t*)ix_arr.data(), input_data.numeric_data + input_data.nrows * col, (size_t)0, ix_arr.size()-(size_t)1,
                          model_params.missing_action, this->box_low[col], this->box_high[col], unsplittable);
            }

            if (unsplittable)
            {
                this->box_low[col] = 0;
                this->box_high[col] = 0;
                col_sampler.drop_col(col);
            }
        }
    }

    // else if (input_data.ncols_numeric)
    // {
    //     size_t n_unsplittable = 0;
    //     std::vector<size_t> unsplittable_cols;
    //     if (col_sampler_is_fresh && !col_sampler.has_weights())
    //         unsplittable_cols.reserve(input_data.ncols_numeric);

    //     /* TODO: this will do unnecessary calculations when using 'leave_m_cols' */
    //     for (size_t col = 0; col < input_data.ncols_numeric; col++)
    //     {
    //         if (input_data.Xc_indptr != NULL)
    //         {
    //             get_range((size_t*)ix_arr.data(), (size_t)0, ix_arr.size()-(size_t)1, col,
    //                       input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
    //                       model_params.missing_action, this->box_low[col], this->box_high[col], unsplittable);
    //         }

    //         else
    //         {
    //             get_range((size_t*)ix_arr.data(), input_data.numeric_data + input_data.nrows * col, (size_t)0, ix_arr.size()-(size_t)1,
    //                       model_params.missing_action, this->box_low[col], this->box_high[col], unsplittable);
    //         }

    //         if (unsplittable)
    //         {
    //             this->box_low[col] = 0;
    //             this->box_high[col] = 0;
    //             n_unsplittable++;
    //             if (col_sampler.has_weights())
    //                 col_sampler.drop_col(col);
    //             else if (col_sampler_is_fresh)
    //                 unsplittable_cols.push_back(col);
    //         }
    //     }

    //     if (n_unsplittable && col_sampler_is_fresh && !col_sampler.has_weights())
    //     {
    //         #if (__cplusplus >= 202002L)
    //         for (auto col : unsplittable_cols | std::views::reverse)
    //             col_sampler.drop_from_tail(col);
    //         #else
    //         for (size_t inv_col = 0; inv_col < unsplittable_cols.size(); inv_col++)
    //         {
    //             size_t col = unsplittable_cols.size() - inv_col - 1;
    //             col_sampler.drop_from_tail(unsplittable_cols[col]);
    //         }
    //         #endif
    //     }

    //     else if (n_unsplittable > model_params.sample_size / 16 && !col_sampler_is_fresh && !col_sampler.has_weights())
    //     {
    //         /* TODO */
    //     }
    // }
}